

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockInference.cpp
# Opt level: O2

void __thiscall
slang::analysis::SampledValueFuncVisitor::visit<slang::ast::StructuredAssignmentPatternExpression>
          (SampledValueFuncVisitor *this,StructuredAssignmentPatternExpression *expr)

{
  long lVar1;
  bool bVar2;
  KnownSystemName KVar3;
  Type *pTVar4;
  Diagnostic *this_00;
  string_view arg;
  
  bVar2 = ClockInference::isSampledValueFuncCall((Expression *)expr);
  if (!bVar2) {
    ast::StructuredAssignmentPatternExpression::
    visitExprs<slang::analysis::SampledValueFuncVisitor&>(expr,this);
    return;
  }
  KVar3 = ast::CallExpression::getKnownSystemName((CallExpression *)expr);
  lVar1 = *(long *)&expr[1].super_AssignmentPatternExpressionBase.super_Expression;
  if (KVar3 == Past) {
    if (lVar1 != 4) goto LAB_002996ea;
    pTVar4 = (Type *)expr->defaultSetter->syntax;
  }
  else {
    if (lVar1 != 2) goto LAB_002996ea;
    pTVar4 = (expr->defaultSetter->type).ptr;
  }
  if ((pTVar4->super_Symbol).kind != TypeRefType) {
    return;
  }
LAB_002996ea:
  this_00 = AnalysisContext::addDiag
                      (this->context,this->parentSymbol,(DiagCode)0x8000e,
                       (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange);
  arg = ast::CallExpression::getSubroutineName((CallExpression *)expr);
  Diagnostic::operator<<(this_00,arg);
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (ClockInference::isSampledValueFuncCall(expr)) {
                auto& call = expr.template as<CallExpression>();
                bool hasClock;
                if (call.getKnownSystemName() == KnownSystemName::Past) {
                    hasClock = call.arguments().size() == 4 &&
                               call.arguments()[3]->kind != ExpressionKind::EmptyArgument;
                }
                else {
                    hasClock = call.arguments().size() == 2 &&
                               call.arguments()[1]->kind != ExpressionKind::EmptyArgument;
                }

                if (!hasClock) {
                    context.addDiag(parentSymbol, diag::SampledValueFuncClock, call.sourceRange)
                        << call.getSubroutineName();
                }
            }
            else if constexpr (HasVisitExprs<T, SampledValueFuncVisitor>) {
                expr.visitExprs(*this);
            }
        }
    }